

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.cpp
# Opt level: O3

void __thiscall
Js::SourceDynamicProfileManager::EnsureStartupFunctions
          (SourceDynamicProfileManager *this,uint numberOfFunctions)

{
  Type *addr;
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  undefined4 *puVar4;
  BVFixed *pBVar5;
  BVFixed *pBVar6;
  
  if (numberOfFunctions == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceDynamicProfileManager.cpp"
                                ,0x45,"(numberOfFunctions != 0)","numberOfFunctions != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  addr = &this->startupFunctions;
  pBVar6 = (this->startupFunctions).ptr;
  if (pBVar6 == (BVFixed *)0x0) {
    pBVar6 = (BVFixed *)0x0;
  }
  else {
    BVar3 = BVFixed::Length(pBVar6);
    if (numberOfFunctions <= BVar3) {
      return;
    }
    pBVar6 = addr->ptr;
  }
  pBVar5 = BVFixed::New<Memory::Recycler>(numberOfFunctions,this->recycler,false);
  Memory::Recycler::WBSetBit((char *)addr);
  (this->startupFunctions).ptr = pBVar5;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  if (pBVar6 == (BVFixed *)0x0) {
    return;
  }
  BVFixed::Copy(addr->ptr,pBVar6);
  return;
}

Assistant:

void SourceDynamicProfileManager::EnsureStartupFunctions(uint numberOfFunctions)
    {
        Assert(numberOfFunctions != 0);
        if(!startupFunctions || numberOfFunctions > startupFunctions->Length())
        {
            BVFixed* oldStartupFunctions = this->startupFunctions;
            startupFunctions = BVFixed::New(numberOfFunctions, this->GetRecycler());
            if(oldStartupFunctions)
            {
                this->startupFunctions->Copy(oldStartupFunctions);
            }
        }
    }